

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_partial_forceExtDict
              (char *source,char *dest,int compressedSize,int targetOutputSize,int dstCapacity,
              void *dictStart,size_t dictSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  ushort uVar6;
  undefined8 uVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ushort *puVar14;
  ushort *puVar15;
  BYTE *d;
  byte *pbVar16;
  size_t __n;
  byte *__dest;
  byte *pbVar17;
  ushort *puVar18;
  uint uVar19;
  ulong uVar20;
  BYTE *s_1;
  ushort *__src;
  ulong uVar21;
  BYTE *e;
  int local_58;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  iVar9 = -1;
  if (-1 < dstCapacity && source != (char *)0x0) {
    lVar11 = (long)dictStart + dictSize;
    if (dictStart == (void *)0x0) {
      lVar11 = 0;
    }
    if (dstCapacity == 0) {
      iVar9 = 0;
    }
    else if (compressedSize != 0) {
      pbVar2 = (byte *)(source + compressedSize);
      pbVar3 = (byte *)(dest + (uint)dstCapacity);
      puVar14 = (ushort *)source;
      __dest = (byte *)dest;
      if ((uint)dstCapacity < 0x40) goto LAB_0014c4d7;
      puVar1 = (ushort *)(pbVar2 + -0xf);
      puVar15 = (ushort *)source;
LAB_0014c113:
      do {
        __src = (ushort *)((long)puVar15 + 1);
        bVar5 = (byte)*puVar15;
        uVar19 = (uint)bVar5;
        uVar12 = (ulong)(uint)(bVar5 >> 4);
        if (bVar5 >> 4 == 0xf) {
          puVar18 = __src;
          if ((puVar1 <= __src) || (puVar18 = puVar15 + 1, puVar1 < puVar18)) goto LAB_0014c4ba;
          uVar12 = (ulong)*(byte *)__src;
          if (uVar12 == 0xff) {
            uVar12 = 0xff;
            puVar14 = puVar18;
            do {
              puVar18 = (ushort *)((long)puVar14 + 1);
              if (puVar1 < puVar18) goto LAB_0014c4ba;
              uVar6 = *puVar14;
              uVar12 = uVar12 + (byte)uVar6;
              puVar14 = puVar18;
            } while ((ulong)(byte)uVar6 == 0xff);
            if (uVar12 == 0xffffffffffffffff) goto LAB_0014c4ba;
          }
          uVar12 = uVar12 + 0xf;
          puVar14 = (ushort *)((long)puVar18 + uVar12);
          pbVar16 = __dest + uVar12;
          if ((CARRY8((ulong)__dest,uVar12)) || (CARRY8((ulong)puVar18,uVar12))) goto LAB_0014c4ba;
          __src = puVar18;
          if (dest + ((ulong)(uint)dstCapacity - 0x20) < pbVar16) goto LAB_0014c5a1;
          if (pbVar2 + -0x20 < puVar14) goto LAB_0014c5a1;
          lVar13 = 0;
          do {
            uVar7 = *(undefined8 *)((byte *)((long)puVar18 + lVar13) + 8);
            pbVar17 = __dest + lVar13;
            *(undefined8 *)pbVar17 = *(undefined8 *)((long)puVar18 + lVar13);
            *(undefined8 *)(pbVar17 + 8) = uVar7;
            pbVar4 = (byte *)((long)puVar18 + lVar13 + 0x10);
            uVar7 = *(undefined8 *)(pbVar4 + 8);
            *(undefined8 *)(pbVar17 + 0x10) = *(undefined8 *)pbVar4;
            *(undefined8 *)(pbVar17 + 0x18) = uVar7;
            lVar13 = lVar13 + 0x20;
          } while (pbVar17 + 0x20 < pbVar16);
        }
        else {
          if (pbVar2 + -0x11 < __src) goto LAB_0014c5a1;
          uVar7 = *(undefined8 *)((long)puVar15 + 9);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar7;
          puVar14 = (ushort *)((long)__src + uVar12);
          pbVar16 = __dest + uVar12;
        }
        uVar6 = *puVar14;
        uVar12 = (ulong)uVar6;
        puVar15 = puVar14 + 1;
        pbVar17 = pbVar16 + -uVar12;
        uVar20 = (ulong)(bVar5 & 0xf);
        if (uVar20 == 0xf) {
          puVar14 = (ushort *)((long)puVar14 + 3);
          puVar18 = puVar14;
          if (pbVar2 + -4 < puVar14) goto LAB_0014c4ba;
          uVar20 = (ulong)(byte)*puVar15;
          if (uVar20 == 0xff) {
            uVar20 = 0xff;
            puVar15 = puVar14;
            do {
              puVar14 = (ushort *)((long)puVar15 + 1);
              puVar18 = puVar14;
              if (pbVar2 + -4 < puVar14) goto LAB_0014c4ba;
              uVar8 = *puVar15;
              uVar20 = uVar20 + (byte)uVar8;
              puVar15 = puVar14;
            } while ((ulong)(byte)uVar8 == 0xff);
            if (uVar20 == 0xffffffffffffffff) goto LAB_0014c4ba;
          }
          uVar20 = uVar20 + 0x13;
          puVar18 = puVar14;
          if (CARRY8((ulong)pbVar16,uVar20)) goto LAB_0014c4ba;
          puVar15 = puVar14;
          if (pbVar3 + -0x40 <= pbVar16 + uVar20) goto LAB_0014c6a9;
        }
        else {
          __dest = pbVar16 + uVar20 + 4;
          uVar20 = uVar20 + 4;
          puVar14 = puVar15;
          if (pbVar3 + -0x40 <= __dest) goto LAB_0014c6a9;
          if ((dest <= pbVar17) && (7 < uVar6)) {
            *(undefined8 *)pbVar16 = *(undefined8 *)pbVar17;
            *(undefined8 *)(pbVar16 + 8) = *(undefined8 *)(pbVar17 + 8);
            *(undefined2 *)(pbVar16 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
            goto LAB_0014c113;
          }
        }
        if ((dictSize < 0x10000) && (puVar18 = puVar15, pbVar17 + dictSize < dest))
        goto LAB_0014c4ba;
        __dest = pbVar16 + uVar20;
        if (pbVar17 < dest) {
          if ((pbVar3 + -5 < __dest) && ((ulong)((long)pbVar3 - (long)pbVar16) <= uVar20)) {
            uVar20 = (long)pbVar3 - (long)pbVar16;
          }
          uVar21 = (long)dest - (long)pbVar17;
          uVar12 = uVar20 - uVar21;
          if (uVar20 < uVar21 || uVar12 == 0) {
            memmove(pbVar16,(void *)(lVar11 - uVar21),uVar20);
          }
          else {
            memcpy(pbVar16,(void *)(lVar11 - uVar21),uVar21);
            __dest = pbVar16 + uVar21;
            if ((ulong)((long)__dest - (long)dest) < uVar12) {
              pbVar17 = (byte *)dest;
              for (; __dest < pbVar16 + uVar20; __dest = __dest + 1) {
                bVar5 = *pbVar17;
                pbVar17 = pbVar17 + 1;
                *__dest = bVar5;
              }
              goto LAB_0014c113;
            }
            memcpy(__dest,dest,uVar12);
          }
          __dest = pbVar16 + uVar20;
          goto LAB_0014c113;
        }
        if (uVar6 < 0x10) {
          if (uVar12 == 4) {
            iVar9 = *(int *)pbVar17;
          }
          else if (uVar6 == 2) {
            iVar9 = CONCAT22(*(undefined2 *)pbVar17,*(undefined2 *)pbVar17);
          }
          else {
            if (uVar6 != 1) {
              if (uVar6 < 8) {
                pbVar16[0] = 0;
                pbVar16[1] = 0;
                pbVar16[2] = 0;
                pbVar16[3] = 0;
                *pbVar16 = *pbVar17;
                pbVar16[1] = pbVar17[1];
                pbVar16[2] = pbVar17[2];
                pbVar16[3] = pbVar17[3];
                uVar19 = inc32table[uVar6];
                *(undefined4 *)(pbVar16 + 4) = *(undefined4 *)(pbVar17 + uVar19);
                pbVar17 = pbVar17 + ((ulong)uVar19 - (long)dec64table[uVar6]);
              }
              else {
                *(undefined8 *)pbVar16 = *(undefined8 *)pbVar17;
                pbVar17 = pbVar17 + 8;
              }
              pbVar16 = pbVar16 + 8;
              do {
                *(undefined8 *)pbVar16 = *(undefined8 *)pbVar17;
                pbVar16 = pbVar16 + 8;
                pbVar17 = pbVar17 + 8;
              } while (pbVar16 < __dest);
              goto LAB_0014c113;
            }
            iVar9 = (uint)*pbVar17 * 0x1010101;
          }
          do {
            *(int *)pbVar16 = iVar9;
            *(int *)(pbVar16 + 4) = iVar9;
            pbVar16 = pbVar16 + 8;
          } while (pbVar16 < __dest);
          goto LAB_0014c113;
        }
        do {
          uVar7 = *(undefined8 *)(pbVar16 + -uVar12 + 8);
          *(undefined8 *)pbVar16 = *(undefined8 *)(pbVar16 + -uVar12);
          *(undefined8 *)(pbVar16 + 8) = uVar7;
          uVar7 = *(undefined8 *)(pbVar16 + -uVar12 + 0x10 + 8);
          *(undefined8 *)(pbVar16 + 0x10) = *(undefined8 *)(pbVar16 + -uVar12 + 0x10);
          *(undefined8 *)(pbVar16 + 0x18) = uVar7;
          pbVar16 = pbVar16 + 0x20;
        } while (pbVar16 < __dest);
      } while( true );
    }
  }
  return iVar9;
LAB_0014c6a9:
  if ((dictSize < 0x10000) && (puVar18 = puVar14, pbVar17 + dictSize < dest)) goto LAB_0014c4ba;
  __dest = pbVar16 + uVar20;
  if (pbVar17 < dest) {
    if ((pbVar3 + -5 < __dest) && ((ulong)((long)pbVar3 - (long)pbVar16) <= uVar20)) {
      uVar20 = (long)pbVar3 - (long)pbVar16;
    }
    uVar12 = (long)dest - (long)pbVar17;
    uVar21 = uVar20 - uVar12;
    if (uVar20 < uVar12 || uVar21 == 0) {
      memmove(pbVar16,(void *)(lVar11 - uVar12),uVar20);
    }
    else {
      memcpy(pbVar16,(void *)(lVar11 - uVar12),uVar12);
      __dest = pbVar16 + uVar12;
      if ((ulong)((long)__dest - (long)dest) < uVar21) {
        pbVar17 = (byte *)dest;
        for (; __dest < pbVar16 + uVar20; __dest = __dest + 1) {
          bVar5 = *pbVar17;
          pbVar17 = pbVar17 + 1;
          *__dest = bVar5;
        }
        goto LAB_0014c4d7;
      }
      memcpy(__dest,dest,uVar21);
    }
    __dest = pbVar16 + uVar20;
  }
  else if (pbVar3 + -0xc < __dest) {
    uVar12 = (long)pbVar3 - (long)pbVar16;
    if (uVar20 < (ulong)((long)pbVar3 - (long)pbVar16)) {
      uVar12 = uVar20;
    }
    __dest = pbVar16 + uVar12;
    if (pbVar16 < pbVar17 + uVar12) {
      for (; pbVar16 < __dest; pbVar16 = pbVar16 + 1) {
        bVar5 = *pbVar17;
        pbVar17 = pbVar17 + 1;
        *pbVar16 = bVar5;
      }
    }
    else {
      memcpy(pbVar16,pbVar17,uVar12);
    }
    pbVar17 = pbVar3;
    if (__dest == pbVar3) goto LAB_0014c84a;
  }
  else {
    if ((uint)uVar12 < 8) {
      pbVar16[0] = 0;
      pbVar16[1] = 0;
      pbVar16[2] = 0;
      pbVar16[3] = 0;
      *pbVar16 = *pbVar17;
      pbVar16[1] = pbVar17[1];
      pbVar16[2] = pbVar17[2];
      pbVar16[3] = pbVar17[3];
      uVar12 = (ulong)((uint)uVar12 << 2);
      uVar21 = (ulong)*(uint *)((long)inc32table + uVar12);
      *(undefined4 *)(pbVar16 + 4) = *(undefined4 *)(pbVar17 + uVar21);
      pbVar17 = pbVar17 + (uVar21 - (long)*(int *)((long)dec64table + uVar12));
    }
    else {
      *(undefined8 *)pbVar16 = *(undefined8 *)pbVar17;
      pbVar17 = pbVar17 + 8;
    }
    *(undefined8 *)(pbVar16 + 8) = *(undefined8 *)pbVar17;
    if (0x10 < uVar20) {
      pbVar16 = pbVar16 + 0x10;
      do {
        pbVar17 = pbVar17 + 8;
        *(undefined8 *)pbVar16 = *(undefined8 *)pbVar17;
        pbVar16 = pbVar16 + 8;
      } while (pbVar16 < __dest);
    }
  }
LAB_0014c4d7:
  while( true ) {
    __src = (ushort *)((long)puVar14 + 1);
    uVar19 = (uint)(byte)*puVar14;
    uVar10 = (uint)(byte)((byte)*puVar14 >> 4);
    uVar12 = (ulong)uVar10;
    if (uVar10 == 0xf) break;
    if ((source + (long)compressedSize + -0x10 <= __src) ||
       (dest + ((ulong)(uint)dstCapacity - 0x20) < __dest)) goto LAB_0014c5a1;
    uVar7 = *(undefined8 *)((long)puVar14 + 9);
    *(undefined8 *)__dest = *(undefined8 *)__src;
    *(undefined8 *)(__dest + 8) = uVar7;
    pbVar16 = __dest + uVar12;
    uVar20 = (ulong)(uVar19 & 0xf);
    puVar14 = (ushort *)((long)__src + uVar12) + 1;
    uVar6 = *(ushort *)((long)__src + uVar12);
    uVar12 = (ulong)uVar6;
    pbVar17 = pbVar16 + -uVar12;
    if (((uVar20 == 0xf) || (uVar6 < 8)) || (pbVar17 < dest)) goto LAB_0014c652;
    *(undefined8 *)pbVar16 = *(undefined8 *)pbVar17;
    *(undefined8 *)(pbVar16 + 8) = *(undefined8 *)(pbVar17 + 8);
    *(undefined2 *)(pbVar16 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
    __dest = pbVar16 + uVar20 + 4;
  }
  puVar1 = (ushort *)(pbVar2 + -0xf);
  puVar18 = __src;
  if ((puVar1 <= __src) || (puVar18 = puVar14 + 1, puVar1 < puVar18)) goto LAB_0014c4ba;
  uVar12 = (ulong)*(byte *)__src;
  if (uVar12 == 0xff) {
    uVar12 = 0xff;
    do {
      puVar14 = puVar18;
      puVar18 = (ushort *)((long)puVar14 + 1);
      if (puVar1 < puVar18) goto LAB_0014c8b4;
      uVar12 = uVar12 + (byte)*puVar14;
    } while ((ulong)(byte)*puVar14 == 0xff);
    if (uVar12 == 0xffffffffffffffff) {
LAB_0014c8b4:
      puVar18 = (ushort *)((long)puVar14 + 1);
LAB_0014c4ba:
      local_58 = (int)source;
      return ~(uint)puVar18 + local_58;
    }
  }
  uVar12 = uVar12 + 0xf;
  if ((CARRY8((ulong)__dest,uVar12)) || (__src = puVar18, CARRY8((ulong)puVar18,uVar12)))
  goto LAB_0014c4ba;
LAB_0014c5a1:
  pbVar16 = __dest + uVar12;
  if ((pbVar3 + -0xc < pbVar16) ||
     (puVar14 = (ushort *)(uVar12 + (long)__src), pbVar2 + -8 < puVar14)) {
    if (pbVar2 < (byte *)(uVar12 + (long)__src)) {
      pbVar16 = __dest + ((long)pbVar2 - (long)__src);
      uVar12 = (long)pbVar2 - (long)__src;
    }
    __n = (long)pbVar3 - (long)__dest;
    if (pbVar16 <= pbVar3) {
      __n = uVar12;
    }
    memmove(__dest,__src,__n);
    pbVar17 = __dest + __n;
    if ((pbVar3 <= pbVar16) ||
       (puVar14 = (ushort *)((long)__src + __n), pbVar16 = pbVar17, pbVar2 + -2 <= puVar14)) {
LAB_0014c84a:
      return (int)pbVar17 - (int)dest;
    }
  }
  else {
    do {
      *(undefined8 *)__dest = *(undefined8 *)__src;
      __dest = __dest + 8;
      __src = __src + 4;
    } while (__dest < pbVar16);
  }
  uVar12 = (ulong)*puVar14;
  puVar14 = puVar14 + 1;
  pbVar17 = pbVar16 + -uVar12;
  uVar20 = (ulong)(uVar19 & 0xf);
LAB_0014c652:
  puVar18 = puVar14;
  if ((int)uVar20 == 0xf) {
    puVar18 = (ushort *)((long)puVar14 + 1);
    if (pbVar2 + -4 < puVar18) goto LAB_0014c4ba;
    uVar21 = (ulong)(byte)*puVar14;
    if (uVar21 == 0xff) {
      uVar21 = 0xff;
      puVar14 = puVar18;
      do {
        puVar18 = (ushort *)((long)puVar14 + 1);
        if (pbVar2 + -4 < puVar18) {
          puVar18 = (ushort *)((long)puVar14 + 1);
          goto LAB_0014c4ba;
        }
        uVar6 = *puVar14;
        uVar21 = uVar21 + (byte)uVar6;
        puVar14 = puVar18;
      } while ((ulong)(byte)uVar6 == 0xff);
    }
    uVar20 = uVar21 + 0xf;
    if ((uVar21 == 0xffffffffffffffff) || (CARRY8((ulong)pbVar16,uVar20))) goto LAB_0014c4ba;
  }
  uVar20 = uVar20 + 4;
  puVar14 = puVar18;
  goto LAB_0014c6a9;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_partial_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int targetOutputSize, int dstCapacity,
                                     const void* dictStart, size_t dictSize)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(source, dest, compressedSize, dstCapacity,
                                  partial_decode, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}